

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

RegexMatcher *
Catch::Matchers::Matches
          (RegexMatcher *__return_storage_ptr__,string *regex,CaseSensitive caseSensitivity)

{
  string local_40;
  CaseSensitive local_1c;
  string *psStack_18;
  CaseSensitive caseSensitivity_local;
  string *regex_local;
  
  local_1c = caseSensitivity;
  psStack_18 = regex;
  regex_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_40,(string *)regex);
  RegexMatcher::RegexMatcher(__return_storage_ptr__,&local_40,local_1c);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

RegexMatcher Matches(std::string const& regex, CaseSensitive caseSensitivity) {
        return RegexMatcher(regex, caseSensitivity);
    }